

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_op_addr_add(DisasContext_conflict6 *ctx,TCGv_i64 ret,TCGv_i64 arg0,TCGv_i64 arg1)

{
  TCGContext_conflict6 *tcg_ctx;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  tcg_gen_add_i64(tcg_ctx,ret,arg0,arg1);
  if ((ctx->hflags & 0x200) == 0) {
    return;
  }
  tcg_gen_ext32s_i64_mips64el(tcg_ctx,ret,ret);
  return;
}

Assistant:

static inline void gen_op_addr_add(DisasContext *ctx, TCGv ret, TCGv arg0,
                                   TCGv arg1)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    tcg_gen_add_tl(tcg_ctx, ret, arg0, arg1);

#if defined(TARGET_MIPS64)
    if (ctx->hflags & MIPS_HFLAG_AWRAP) {
        tcg_gen_ext32s_i64(tcg_ctx, ret, ret);
    }
#endif
}